

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

RegSlot __thiscall
ByteCodeGenerator::EnregisterStringTemplateCallsiteConstant
          (ByteCodeGenerator *this,ParseNode *pnode)

{
  Type pFVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseNodeStrTemplate *pPVar5;
  Type *ppFVar6;
  ParseNode *local_30;
  ParseNode *pnode_local;
  RegSlot loc;
  
  local_30 = pnode;
  if (pnode->nop != knopStrTemplate) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x3f1,"(pnode->nop == knopStrTemplate)","pnode->nop == knopStrTemplate");
    if (!bVar3) goto LAB_0082f241;
    *puVar4 = 0;
  }
  pPVar5 = ParseNode::AsParseNodeStrTemplate(local_30);
  if ((pPVar5->field_0x2a & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x3f2,"(pnode->AsParseNodeStrTemplate()->isTaggedTemplate)",
                       "pnode->AsParseNodeStrTemplate()->isTaggedTemplate");
    if (!bVar3) {
LAB_0082f241:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pnode_local._4_4_ = 0xffffffff;
  ppFVar6 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this->funcInfoStack->
                        super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  pFVar1 = *ppFVar6;
  bVar3 = JsUtil::
          BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<ParseNode*>
                    ((BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&pFVar1->stringTemplateCallsiteRegisterMap,&local_30,
                     (uint *)((long)&pnode_local + 4));
  if (!bVar3) {
    ppFVar6 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                        (&this->funcInfoStack->
                          super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    pnode_local._4_4_ = FuncInfo::NextConstRegister(*ppFVar6);
    JsUtil::
    BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)&pFVar1->stringTemplateCallsiteRegisterMap,&local_30,
               (uint *)((long)&pnode_local + 4));
  }
  return pnode_local._4_4_;
}

Assistant:

Js::RegSlot ByteCodeGenerator::EnregisterStringTemplateCallsiteConstant(ParseNode* pnode)
{
    Assert(pnode->nop == knopStrTemplate);
    Assert(pnode->AsParseNodeStrTemplate()->isTaggedTemplate);

    Js::RegSlot loc = Js::Constants::NoRegister;
    FuncInfo* top = funcInfoStack->Top();

    if (!top->stringTemplateCallsiteRegisterMap.TryGetValue(pnode, &loc))
    {
        loc = NextConstRegister();

        top->stringTemplateCallsiteRegisterMap.Add(pnode, loc);
    }

    return loc;
}